

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

bool cmOutputConverter::Shell_CharNeedsQuotes(char c,int flags)

{
  uint uVar1;
  int iVar2;
  
  if ((flags & 0x104U) == 4) {
    return false;
  }
  iVar2 = (int)c;
  if (((iVar2 != 9) && (iVar2 != 0x20)) && ((c == '-' & (byte)((uint)flags >> 10) & 1) == 0)) {
    uVar1 = iVar2 - 0x23;
    if (((uint)flags >> 8 & 1) == 0) {
      if ((uVar1 < 0x3c) && ((0x80000000a000019U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
        return true;
      }
    }
    else {
      if ((uVar1 < 0x3e) && ((0x2a0000000b0000fbU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
        return true;
      }
      if (iVar2 == 0x7e) {
        return true;
      }
    }
    if (iVar2 != 0x7c) {
      return false;
    }
  }
  return true;
}

Assistant:

bool cmOutputConverter::Shell_CharNeedsQuotes(char c, int flags)
{
  /* On Windows the built-in command shell echo never needs quotes.  */
  if (!(flags & Shell_Flag_IsUnix) && (flags & Shell_Flag_EchoWindows)) {
    return false;
  }

  /* On all platforms quotes are needed to preserve whitespace.  */
  if (Shell_CharIsWhitespace(c)) {
    return true;
  }

  /* Quote hyphens in response files */
  if (flags & Shell_Flag_IsResponse) {
    if (c == '-') {
      return true;
    }
  }

  if (flags & Shell_Flag_IsUnix) {
    /* On UNIX several special characters need quotes to preserve them.  */
    if (Shell_CharNeedsQuotesOnUnix(c)) {
      return true;
    }
  } else {
    /* On Windows several special characters need quotes to preserve them.  */
    if (Shell_CharNeedsQuotesOnWindows(c)) {
      return true;
    }
  }
  return false;
}